

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashlist.c
# Opt level: O1

ktx_error_code_e ktxHashList_FindEntry(ktxHashList *pHead,char *key,ktxHashListEntry **ppEntry)

{
  ktxHashList pkVar1;
  UT_hash_table *pUVar2;
  UT_hash_handle *pUVar3;
  ktx_error_code_e kVar4;
  size_t sVar5;
  char *pcVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  ktxHashListEntry *pkVar14;
  uint uVar15;
  
  kVar4 = KTX_INVALID_VALUE;
  if (key != (char *)0x0 && pHead != (ktxHashList *)0x0) {
    pkVar1 = *pHead;
    if (pkVar1 != (ktxHashList)0x0) {
      sVar5 = strlen(key);
      uVar15 = (uint)sVar5;
      pcVar6 = key;
      if (uVar15 < 0xc) {
        uVar9 = 0x9e3779b9;
        uVar10 = 0xfeedbeef;
        uVar12 = 0x9e3779b9;
        uVar7 = uVar15;
      }
      else {
        uVar10 = 0xfeedbeef;
        uVar12 = 0x9e3779b9;
        uVar11 = sVar5 & 0xffffffff;
        uVar9 = 0x9e3779b9;
        do {
          iVar8 = (uint)(byte)pcVar6[7] * 0x1000000 + pcVar6[6] * 0x10000 +
                  pcVar6[5] * 0x100 + (int)pcVar6[4] + uVar12;
          uVar7 = (uint)(byte)pcVar6[0xb] * 0x1000000 + pcVar6[10] * 0x10000 +
                  pcVar6[9] * 0x100 + (int)pcVar6[8] + uVar10;
          uVar12 = uVar7 >> 0xd ^
                   (((uint)(byte)pcVar6[3] * 0x1000000 + pcVar6[2] * 0x10000 +
                    pcVar6[1] * 0x100 + (int)*pcVar6 + uVar9) - iVar8) - uVar7;
          uVar10 = uVar12 << 8 ^ (iVar8 - uVar7) - uVar12;
          uVar9 = uVar10 >> 0xd ^ (uVar7 - uVar12) - uVar10;
          uVar7 = uVar9 >> 0xc ^ (uVar12 - uVar10) - uVar9;
          uVar10 = uVar7 << 0x10 ^ (uVar10 - uVar9) - uVar7;
          uVar13 = uVar10 >> 5 ^ (uVar9 - uVar7) - uVar10;
          uVar9 = uVar13 >> 3 ^ (uVar7 - uVar10) - uVar13;
          uVar12 = uVar9 << 10 ^ (uVar10 - uVar13) - uVar9;
          uVar10 = uVar12 >> 0xf ^ (uVar13 - uVar9) - uVar12;
          pcVar6 = pcVar6 + 0xc;
          uVar7 = (int)uVar11 - 0xc;
          uVar11 = (ulong)uVar7;
        } while (0xb < uVar7);
      }
      uVar10 = uVar10 + uVar15;
      switch(uVar7) {
      case 0xb:
        uVar10 = (uint)(byte)pcVar6[10] * 0x1000000 + uVar10;
      case 10:
        uVar10 = pcVar6[9] * 0x10000 + uVar10;
      case 9:
        uVar10 = pcVar6[8] * 0x100 + uVar10;
      case 8:
        uVar12 = (uint)(byte)pcVar6[7] * 0x1000000 + uVar12;
      case 7:
        uVar12 = pcVar6[6] * 0x10000 + uVar12;
      case 6:
        uVar12 = pcVar6[5] * 0x100 + uVar12;
      case 5:
        uVar12 = (int)pcVar6[4] + uVar12;
      case 4:
        uVar9 = (uint)(byte)pcVar6[3] * 0x1000000 + uVar9;
      case 3:
        uVar9 = pcVar6[2] * 0x10000 + uVar9;
      case 2:
        uVar9 = pcVar6[1] * 0x100 + uVar9;
      case 1:
        uVar9 = (int)*pcVar6 + uVar9;
      }
      uVar7 = uVar10 >> 0xd ^ (uVar9 - uVar10) - uVar12;
      uVar12 = uVar7 << 8 ^ (uVar12 - uVar10) - uVar7;
      uVar10 = uVar12 >> 0xd ^ (uVar10 - uVar7) - uVar12;
      uVar9 = uVar10 >> 0xc ^ (uVar7 - uVar12) - uVar10;
      uVar7 = uVar9 << 0x10 ^ (uVar12 - uVar10) - uVar9;
      uVar10 = uVar7 >> 5 ^ (uVar10 - uVar9) - uVar7;
      uVar9 = uVar10 >> 3 ^ (uVar9 - uVar7) - uVar10;
      uVar7 = uVar9 << 10 ^ (uVar7 - uVar10) - uVar9;
      pUVar2 = (pkVar1->hh).tbl;
      pUVar3 = pUVar2->buckets[pUVar2->num_buckets - 1 & (uVar7 >> 0xf ^ uVar10 - (uVar9 + uVar7))].
               hh_head;
      if (pUVar3 == (UT_hash_handle *)0x0) {
        pkVar14 = (ktxHashListEntry *)0x0;
      }
      else {
        pkVar14 = (ktxHashListEntry *)((long)pUVar3 - pUVar2->hho);
      }
      if (pkVar14 != (ktxHashListEntry *)0x0) {
        do {
          if (((pkVar14->hh).keylen == uVar15) &&
             (iVar8 = bcmp((pkVar14->hh).key,key,sVar5 & 0xffffffff), iVar8 == 0))
          goto LAB_001d3af0;
          pUVar3 = (pkVar14->hh).hh_next;
          if (pUVar3 == (UT_hash_handle *)0x0) {
            pkVar14 = (ktxHashListEntry *)0x0;
          }
          else {
            pkVar14 = (ktxHashListEntry *)((long)pUVar3 - pUVar2->hho);
          }
        } while (pkVar14 != (ktxHashListEntry *)0x0);
      }
    }
    pkVar14 = (ktxHashListEntry *)0x0;
LAB_001d3af0:
    if (pkVar14 == (ktxHashListEntry *)0x0) {
      kVar4 = KTX_NOT_FOUND;
    }
    else {
      *ppEntry = pkVar14;
      kVar4 = KTX_SUCCESS;
    }
  }
  return kVar4;
}

Assistant:

KTX_error_code
ktxHashList_FindEntry(ktxHashList* pHead, const char* key,
                      ktxHashListEntry** ppEntry)
{
    if (pHead && key) {
        ktxKVListEntry* kv;

        HASH_FIND_STR( *pHead, key, kv );  /* kv: output pointer */

        if (kv) {
            *ppEntry = kv;
            return KTX_SUCCESS;
        } else
            return KTX_NOT_FOUND;
    } else
        return KTX_INVALID_VALUE;
}